

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

Aig_Man_t * Fra_ClassesDeriveAig(Fra_Cla_t *p,int nFramesK)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  void *__ptr;
  Aig_Obj_t *pAVar7;
  ulong *__ptr_00;
  Vec_Ptr_t *pVVar8;
  ulong *puVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  Aig_Obj_t *pAVar14;
  uint uVar15;
  int iVar16;
  Aig_Man_t *pAVar17;
  bool bVar18;
  
  pAVar17 = p->pAig;
  if (pAVar17->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x322,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (pAVar17->nObjs[2] <= pAVar17->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x323,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (nFramesK < 1) {
    __assert_fail("nFramesK > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x324,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  p_00 = Aig_ManStart(pAVar17->vObjs->nSize * (nFramesK + 1));
  pAVar17 = p->pAig;
  pcVar1 = pAVar17->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = pAVar17->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  __ptr = malloc((long)pAVar17->vObjs->nSize << 3);
  *(Aig_Obj_t **)((long)__ptr + (long)pAVar17->pConst1->Id * 8) = p_00->pConst1;
  iVar10 = pAVar17->nRegs;
  uVar15 = pAVar17->nObjs[2] - iVar10;
  pVVar8 = pAVar17->vCis;
  if ((int)uVar15 < pVVar8->nSize) {
    uVar11 = (ulong)uVar15;
    do {
      if ((int)uVar15 < 0) {
LAB_005caae6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar8->pArray[uVar11];
      pAVar7 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 8) = pAVar7;
      uVar11 = uVar11 + 1;
      pAVar17 = p->pAig;
      pVVar8 = pAVar17->vCis;
    } while ((int)uVar11 < pVVar8->nSize);
    iVar10 = pAVar17->nRegs;
  }
  __ptr_00 = (ulong *)malloc((long)iVar10 << 3);
  iVar16 = pAVar17->nObjs[2];
  iVar4 = 0;
  do {
    uVar11 = (ulong)(uint)(iVar16 - iVar10);
    if (iVar16 - iVar10 != 0 && iVar10 <= iVar16) {
      lVar12 = 0;
      do {
        if (pAVar17->vCis->nSize <= lVar12) goto LAB_005caae6;
        pvVar2 = pAVar17->vCis->pArray[lVar12];
        pAVar7 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 8) = pAVar7;
        lVar12 = lVar12 + 1;
        pAVar17 = p->pAig;
        uVar11 = (long)pAVar17->nObjs[2] - (long)pAVar17->nRegs;
      } while (lVar12 < (long)uVar11);
    }
    pVVar8 = pAVar17->vCis;
    if ((int)uVar11 < pVVar8->nSize) {
      uVar13 = uVar11 & 0xffffffff;
      do {
        if ((int)uVar11 < 0) goto LAB_005caae6;
        iVar10 = *(int *)((long)pVVar8->pArray[uVar13] + 0x24);
        lVar12 = *(long *)(*(long *)(*(long *)(*(long *)((long)pVVar8->pArray[uVar13] + 0x28) + 0x30
                                              ) + 8) + (long)iVar10 * 8);
        if (lVar12 != 0) {
          iVar16 = *(int *)(lVar12 + 0x24);
          if (iVar10 <= iVar16) goto LAB_005cab05;
          pAVar14 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar10 * 8) & 0xfffffffffffffffe);
          pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar16 * 8) & 0xfffffffffffffffe);
          if (pAVar14 != pAVar7) {
            pAVar7 = Aig_Exor(p_00,pAVar14,pAVar7);
            Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                 ((ulong)(((uint)pAVar7 ^
                                          *(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18) >>
                                          3) & 1) ^ (ulong)pAVar7 ^ 1));
            pAVar17 = p->pAig;
          }
        }
        uVar13 = uVar13 + 1;
        pVVar8 = pAVar17->vCis;
      } while ((int)uVar13 < pVVar8->nSize);
    }
    pVVar8 = pAVar17->vObjs;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar12];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          pAVar7 = Aig_And(p_00,(Aig_Obj_t *)
                                ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                                *(ulong *)((long)__ptr +
                                          (long)*(int *)((*(ulong *)((long)pvVar2 + 8) &
                                                         0xfffffffffffffffe) + 0x24) * 8)),
                           (Aig_Obj_t *)
                           ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                           *(ulong *)((long)__ptr +
                                     (long)*(int *)((*(ulong *)((long)pvVar2 + 0x10) &
                                                    0xfffffffffffffffe) + 0x24) * 8)));
          iVar10 = *(int *)((long)pvVar2 + 0x24);
          *(Aig_Obj_t **)((long)__ptr + (long)iVar10 * 8) = pAVar7;
          lVar3 = *(long *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x28) + 0x30) + 8) +
                           (long)iVar10 * 8);
          if (lVar3 != 0) {
            iVar16 = *(int *)(lVar3 + 0x24);
            if (iVar10 <= iVar16) {
LAB_005cab05:
              __assert_fail("pObjRepr->Id < pObj->Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                            ,0x2fe,
                            "void Fra_ClassesDeriveNode(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t **)");
            }
            pAVar14 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar16 * 8) & 0xfffffffffffffffe)
            ;
            if ((Aig_Obj_t *)((ulong)pAVar7 & 0xfffffffffffffffe) != pAVar14) {
              pAVar7 = Aig_Exor(p_00,(Aig_Obj_t *)((ulong)pAVar7 & 0xfffffffffffffffe),pAVar14);
              Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                   ((ulong)(((uint)pAVar7 ^
                                            *(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18)
                                            >> 3) & 1) ^ (ulong)pAVar7 ^ 1));
            }
          }
        }
        lVar12 = lVar12 + 1;
        pAVar17 = p->pAig;
        pVVar8 = pAVar17->vObjs;
      } while (lVar12 < pVVar8->nSize);
    }
    if (iVar4 == nFramesK) break;
    if (iVar4 == nFramesK + -1) {
      p_00->nAsserts = p_00->nObjs[3];
    }
    iVar10 = pAVar17->nRegs;
    uVar15 = pAVar17->nObjs[3] - iVar10;
    pVVar8 = pAVar17->vCos;
    if ((int)uVar15 < pVVar8->nSize) {
      uVar11 = (ulong)uVar15;
      puVar9 = __ptr_00;
      do {
        if ((int)uVar15 < 0) goto LAB_005caae6;
        uVar13 = *(ulong *)((long)pVVar8->pArray[uVar11] + 8);
        *puVar9 = (ulong)((uint)uVar13 & 1) ^
                  *(ulong *)((long)__ptr + (long)*(int *)((uVar13 & 0xfffffffffffffffe) + 0x24) * 8)
        ;
        uVar11 = uVar11 + 1;
        pVVar8 = pAVar17->vCos;
        puVar9 = puVar9 + 1;
      } while ((int)uVar11 < pVVar8->nSize);
    }
    iVar16 = pAVar17->nObjs[2];
    uVar15 = iVar16 - iVar10;
    pVVar8 = pAVar17->vCis;
    if ((int)uVar15 < pVVar8->nSize) {
      uVar11 = (ulong)uVar15;
      puVar9 = __ptr_00;
      do {
        if ((int)uVar15 < 0) goto LAB_005caae6;
        *(ulong *)((long)__ptr + (long)*(int *)((long)pVVar8->pArray[uVar11] + 0x24) * 8) = *puVar9;
        uVar11 = uVar11 + 1;
        pVVar8 = pAVar17->vCis;
        puVar9 = puVar9 + 1;
      } while ((int)uVar11 < pVVar8->nSize);
    }
    bVar18 = iVar4 != nFramesK;
    iVar4 = iVar4 + 1;
  } while (bVar18);
  if (__ptr_00 != (ulong *)0x0) {
    free(__ptr_00);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (p_00->nObjs[3] % (nFramesK + 1) == 0) {
    printf("Assert miters = %6d. Output miters = %6d.\n",(ulong)(uint)p_00->nAsserts,
           (ulong)(uint)(p_00->nObjs[3] - p_00->nAsserts));
    Aig_ManCleanup(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(pManFraig) % nFramesAll == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x350,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
}

Assistant:

Aig_Man_t * Fra_ClassesDeriveAig( Fra_Cla_t * p, int nFramesK )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches, ** ppEquivs;
    int i, k, f, nFramesAll = nFramesK + 1;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    assert( nFramesK > 0 );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // allocate place for the node mapping
    ppEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );
    Fra_ObjSetEqu( ppEquivs, Aig_ManConst1(p->pAig), Aig_ManConst1(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < nFramesAll; f++ )
    {
        // create PIs for this frame
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Equ(ppEquivs, pObj), Fra_ObjChild1Equ(ppEquivs, pObj) );
            Fra_ObjSetEqu( ppEquivs, pObj, pObjNew );
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        }
        if ( f == nFramesAll - 1 )
            break;
        if ( f == nFramesAll - 2 )
            pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Fra_ObjChild0Equ( ppEquivs, pObj );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, pLatches[k++] );
    }
    ABC_FREE( pLatches );
    ABC_FREE( ppEquivs );
    // mark the asserts
    assert( Aig_ManCoNum(pManFraig) % nFramesAll == 0 );
printf( "Assert miters = %6d. Output miters = %6d.\n", 
       pManFraig->nAsserts, Aig_ManCoNum(pManFraig) - pManFraig->nAsserts );
    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    return pManFraig;
}